

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O3

ex_ex * eval_store(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  long lVar1;
  int iVar2;
  ex_ex *peVar3;
  ex_ex *peVar4;
  t_symbol *ptVar5;
  ex_ex rval;
  anon_union_8_5_735de1bb_for_ex_cont local_68;
  long lStack_60;
  undefined8 local_58;
  anon_union_8_5_735de1bb_for_ex_cont local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_58 = 0;
  local_38 = 0;
  local_48.v_int = 0;
  uStack_40 = 0;
  lStack_60 = 1;
  local_68.v_int = 0;
  lVar1 = eptr->ex_type;
  if (lVar1 == 5) {
    ptVar5 = (t_symbol *)(eptr->ex_cont).v_vec;
LAB_0019bd9b:
    local_68.v_int = 0;
    lStack_60 = 0;
    peVar4 = ex_eval(expr,eptr + 1,(ex_ex *)&local_68,idx);
    if ((peVar4 == (ex_ex *)0x0) ||
       (peVar4 = ex_eval(expr,peVar4,(ex_ex *)&local_48,idx), peVar4 == (ex_ex *)0x0)) {
      return (ex_ex *)0x0;
    }
    optr->ex_type = 1;
    (optr->ex_cont).v_int = 0;
    max_ex_tab_store(expr,ptVar5,(ex_ex *)&local_68,(ex_ex *)&local_48,optr);
joined_r0x0019bdfe:
    if (lStack_60 == 0xf) {
      free(local_68.v_vec);
    }
  }
  else {
    if (lVar1 == 0xd) {
      ptVar5 = (t_symbol *)expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec;
      if (ptVar5 != (t_symbol *)0x0) goto LAB_0019bd9b;
      if ((expr->exp_error & 8) == 0) {
        post("expr: syntax error: no string for inlet %d",(eptr->ex_cont).v_int + 1);
        post("expr: No more table errors will be reported");
        post("expr: till the next reset");
        *(byte *)&expr->exp_error = (byte)expr->exp_error | 8;
      }
    }
    else if (lVar1 == 0x15) {
      ptVar5 = (t_symbol *)(eptr->ex_cont).v_vec;
      peVar3 = ex_eval(expr,eptr + 1,(ex_ex *)&local_68,idx);
      iVar2 = max_ex_var_store(expr,ptVar5,(ex_ex *)&local_68,optr);
      peVar4 = (ex_ex *)0x0;
      if (iVar2 == 0) {
        peVar4 = peVar3;
      }
      goto joined_r0x0019bdfe;
    }
    peVar4 = (ex_ex *)0x0;
    post("Bad left value: ");
    ex_print(eptr);
  }
  return peVar4;
}

Assistant:

struct ex_ex *
eval_store(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
{
        struct ex_ex arg = { 0 };
        struct ex_ex rval = { 0 };
        struct ex_ex *retp;
        char *tbl = (char *) 0;
        char *var = (char *) 0;
        int badleft = 0;
        int notable = 0;

        arg.ex_type = ET_INT;
        arg.ex_int = 0;

        switch (eptr->ex_type) {
        case ET_VAR:
                var = (char *) eptr->ex_ptr;
                eptr = ex_eval(expr, ++eptr, &arg, idx);
                if (max_ex_var_store(expr, (t_symbol *)var, &arg, optr))
                        retp = exNULL;
                else
                        retp = eptr;

                if (arg.ex_type == ET_VEC)
                        fts_free(arg.ex_vec);
                return(retp);
        case ET_TBL:
                tbl = (char *) eptr->ex_ptr;
                break;
        case ET_SI:
                if (!expr->exp_var[eptr->ex_int].ex_ptr) {
                        if (!(expr->exp_error & EE_NOTABLE)) {
                                post("expr: syntax error: no string for inlet %d",
                                                                                                                eptr->ex_int + 1);
                                post("expr: No more table errors will be reported");
                                post("expr: till the next reset");
                                expr->exp_error |= EE_NOTABLE;
                        }
                        badleft++;
                        post("Bad left value: ");
                        /* report Error */
                        ex_print(eptr);
                        retp = exNULL;
                        return (retp);
                } else {
                        tbl = (char *) expr->exp_var[eptr->ex_int].ex_ptr;
                }
                break;
        default:
                post("Bad left value: ");
                /* report Error */
                ex_print(eptr);
                retp = exNULL;
                return (retp);
        }
        arg.ex_type = 0;
        arg.ex_int = 0;
        /* evaluate the index of the table */
        if (!(eptr = ex_eval(expr, ++eptr, &arg, idx)))
                return (eptr);

        /* evaluate the right index of the table */
        if (!(eptr = ex_eval(expr, eptr, &rval, idx)))
                return (eptr);
        optr->ex_type = ET_INT;
        optr->ex_int = 0;
        if (!notable || badleft)
                (void)max_ex_tab_store(expr, (t_symbol *)tbl, &arg, &rval, optr);
        if (arg.ex_type == ET_VEC)
                fts_free(arg.ex_vec);
        return (eptr);
}